

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxid.h
# Opt level: O3

void __thiscall soplex::SPxDevexPR<double>::left4(SPxDevexPR<double> *this,int n,SPxId id)

{
  int iVar1;
  SPxSolverBase<double> *pSVar2;
  pointer pdVar3;
  UpdateVector<double> *pUVar4;
  pointer pdVar5;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  if (id.super_DataKey.info != 0) {
    pSVar2 = (this->super_SPxPricer<double>).thesolver;
    pdVar3 = (pSVar2->theFvec->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    dVar9 = 1.0 / pdVar3[n];
    dVar10 = SSVectorBase<double>::length2(&pSVar2->theCoPvec->thedelta);
    dVar9 = dVar10 * dVar9 * dVar9;
    pUVar4 = ((this->super_SPxPricer<double>).thesolver)->theFvec;
    lVar7 = (long)(pUVar4->thedelta).super_IdxSet.num;
    pdVar5 = (pSVar2->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < lVar7) {
      piVar6 = (pUVar4->thedelta).super_IdxSet.idx;
      uVar8 = lVar7 + 1;
      do {
        iVar1 = piVar6[uVar8 - 2];
        dVar10 = pdVar3[iVar1];
        pdVar5[iVar1] = dVar10 * dVar10 * dVar9 + pdVar5[iVar1];
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
    }
    pdVar5[n] = dVar9;
  }
  return;
}

Assistant:

inline bool isValid() const
   {
      return info != 0;
   }